

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

bool __thiscall cppcms::widgets::base_text::validate(base_text *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]);
  if ((uVar1 & 1) != 0) {
    uVar2 = this->high_;
    if (uVar2 == 0xffffffff && ((uVar1 & 2) == 0 && this->low_ == 0)) {
      return true;
    }
    if (((ulong)(long)this->low_ <= this->code_points_) &&
       (this->code_points_ <= (ulong)uVar2 || (int)uVar2 < 0)) {
      return true;
    }
    *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) = uVar1 & 0xfffffffe;
  }
  return false;
}

Assistant:

bool base_text::validate()
{
	if(!valid())
		return false;
	if(!set() && low_==0 && high_==-1) {
		valid(true);
		return true;
	}
	if(code_points_ < size_t(low_) || (high_ >=0 && code_points_ > size_t(high_))) {
		valid(false);
		return false;
	}
	return true;
}